

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

void free(void *__ptr)

{
  memstate mVar1;
  memdesc *pmVar2;
  hdbg_info *phVar3;
  memdesc **ppmVar4;
  memdesc *pmVar5;
  memdesc_node *pmVar6;
  _Bool _Var7;
  int iVar8;
  undefined8 in_RAX;
  size_t sVar9;
  char *pcVar10;
  guard *pgVar11;
  ulong uVar12;
  hdbg_info *phVar13;
  char *msg;
  undefined8 local_28;
  
  if (__ptr == (void *)0x0) {
    return;
  }
  local_28 = in_RAX;
  _Var7 = use_hdmp();
  if (!_Var7) {
LAB_001018d6:
    if (__ptr <= malloc_headroom + 0xffff && malloc_headroom <= __ptr) {
      return;
    }
    (*real_free)(__ptr);
    return;
  }
  pmVar2 = *(memdesc **)((long)__ptr + -0x10);
  pgVar11 = pmVar2->data;
  mVar1 = *(memstate *)((long)&pgVar11[1].desc + pmVar2->len);
  if (mVar1 != pgVar11->state) {
    pcVar10 = "head state != tail state. memory over/underrun";
LAB_00101954:
    die(pcVar10);
  }
  if (mVar1 != mem_allocated) {
    pcVar10 = "free() passed non-allocated memory";
    goto LAB_00101954;
  }
  if (pgVar11 != (guard *)((long)__ptr + -0x10)) {
    pcVar10 = "internal integrity error";
    goto LAB_00101954;
  }
  getstacktrace(pmVar2->stack,(int)hdbg.maxframes);
  sVar9 = pmVar2->len;
  pgVar11 = pmVar2->data;
  local_28 = 0xdeaddead;
  if ((0 < (int)(uint)sVar9) && (hdbg.doFill != 0)) {
    uVar12 = 0;
    do {
      *(undefined1 *)((long)&pgVar11[1].desc + uVar12) =
           *(undefined1 *)((long)&local_28 + (ulong)((uint)uVar12 & 3));
      uVar12 = uVar12 + 1;
    } while (((uint)sVar9 & 0x7fffffff) != uVar12);
    sVar9 = pmVar2->len;
    pgVar11 = pmVar2->data;
  }
  *(undefined4 *)((long)&pgVar11[1].desc + sVar9) = 0x5a5a5a5a;
  pmVar2->data->state = mem_free;
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&heap_lock);
  if (iVar8 == 0) {
    hdbg.stats.free_calls = hdbg.stats.free_calls + 1;
    hdbg.stats.alloc_total = hdbg.stats.alloc_total - pmVar2->len;
    phVar3 = (hdbg_info *)(pmVar2->node).tqe_next;
    ppmVar4 = (pmVar2->node).tqe_prev;
    phVar13 = phVar3;
    if (phVar3 == (hdbg_info *)0x0) {
      phVar13 = &hdbg;
    }
    ((memdesc_node *)&phVar13->heap)->tqe_prev = ppmVar4;
    *ppmVar4 = (memdesc *)phVar3;
    (pmVar2->node).tqe_next = hdbg.freelist.tqh_first;
    pmVar6 = &(hdbg.freelist.tqh_first)->node;
    if (hdbg.freelist.tqh_first == (memdesc *)0x0) {
      pmVar6 = (memdesc_node *)&hdbg.freelist;
    }
    pmVar6->tqe_prev = (memdesc **)pmVar2;
    hdbg.freelist.tqh_first = pmVar2;
    (pmVar2->node).tqe_prev = &hdbg.freelist.tqh_first;
    if (hdbg.freelistsize == hdbg.freelistmax) {
      pmVar2 = (hdbg.freelist.tqh_last[1]->node).tqe_next;
      pmVar5 = (pmVar2->node).tqe_next;
      ppmVar4 = (pmVar2->node).tqe_prev;
      pmVar6 = &pmVar5->node;
      if (pmVar5 == (memdesc *)0x0) {
        pmVar6 = (memdesc_node *)&hdbg.freelist;
      }
      pmVar6->tqe_prev = ppmVar4;
      *ppmVar4 = pmVar5;
      iVar8 = pthread_mutex_unlock((pthread_mutex_t *)&heap_lock);
      if (iVar8 == 0) {
        __ptr = pmVar2->base;
        sanity_freenode(pmVar2);
        iVar8 = pthread_mutex_lock((pthread_mutex_t *)&descriptors_lock);
        if (iVar8 != 0) goto LAB_00101913;
        if ((pmVar2->len < hdbg.rememberbigger) || (hdbg.maxbig <= hdbg.numbig)) {
          (pmVar2->node).tqe_next = (memdesc *)0x0;
          (pmVar2->node).tqe_prev = hdbg.descriptors.tqh_last;
          *hdbg.descriptors.tqh_last = pmVar2;
          hdbg.descriptors.tqh_last = (memdesc **)pmVar2;
        }
        else {
          (pmVar2->node).tqe_next = (memdesc *)0x0;
          (pmVar2->node).tqe_prev = hdbg.freebig.tqh_last;
          *hdbg.freebig.tqh_last = pmVar2;
          hdbg.numbig = hdbg.numbig + 1;
          hdbg.freebig.tqh_last = (memdesc **)pmVar2;
        }
        iVar8 = pthread_mutex_unlock((pthread_mutex_t *)&descriptors_lock);
        if (iVar8 == 0) goto LAB_001018d6;
      }
    }
    else {
      hdbg.freelistsize = hdbg.freelistsize + 1;
      iVar8 = pthread_mutex_unlock((pthread_mutex_t *)&heap_lock);
      if (iVar8 == 0) {
        return;
      }
    }
    pcVar10 = strerror(iVar8);
    msg = "unlock failed: %s";
  }
  else {
LAB_00101913:
    pcVar10 = strerror(iVar8);
    msg = "lock failed: %s";
  }
  die(msg,pcVar10);
}

Assistant:

void free(void *p) {
    if (p == 0)
        return;
    if (!use_hdmp()) {
        if (!headroom(p))
            real_free(p);
        return;
    }

    struct guard *guard = (struct guard *)p - 1;
    struct memdesc *desc = guard->desc;

    if (get_state(desc) != mem_allocated)
        die("free() passed non-allocated memory");
    if (desc->data != guard)
        die("internal integrity error");

    getstacktrace(desc->stack, hdbg.maxframes);
    fill(desc->data + 1, desc->len, 0xdeaddead);
    set_state(desc, mem_free);

    LOCK(&heap_lock);

    hdbg.stats.free_calls++;
    hdbg.stats.alloc_total -= desc->len;
    TAILQ_REMOVE(&hdbg.heap, desc, node);

    TAILQ_INSERT_HEAD(&hdbg.freelist, desc, node);
    // put this block on the freelist, and extract the oldest block if the list
    // is too big. We will actually free the oldest one now, so we have
    // maintained some hysteresis between the application calling free() and
    // actually freeing the memory.
    if (hdbg.freelistsize == hdbg.freelistmax) {
        desc = TAILQ_LAST(&hdbg.freelist, memdesc_list);
        TAILQ_REMOVE(&hdbg.freelist, desc, node);
    } else {
        hdbg.freelistsize++;
        desc = 0;
    }
    UNLOCK(&heap_lock);

    if (desc) {
        void *p = desc->base;
        free_desc(desc);
        if (!headroom(p))
            real_free(p);
    }
}